

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O1

bool __thiscall Kumu::LogEntry::TestFilter(LogEntry *this,i32_t filter)

{
  uint uVar1;
  
  switch(this->Type) {
  case LOG_DEBUG:
    uVar1 = filter & 1;
    break;
  case LOG_INFO:
    uVar1 = filter & 2;
    break;
  case LOG_WARN:
    uVar1 = filter & 4;
    break;
  case LOG_ERROR:
    uVar1 = filter & 8;
    break;
  case LOG_NOTICE:
    uVar1 = filter & 0x10;
    break;
  case LOG_ALERT:
    uVar1 = filter & 0x20;
    break;
  case LOG_CRIT:
    uVar1 = filter & 0x40;
    break;
  default:
    goto switchD_001167a7_default;
  }
  if (uVar1 == 0) {
    return false;
  }
switchD_001167a7_default:
  return true;
}

Assistant:

bool
Kumu::LogEntry::TestFilter(i32_t filter) const
{
  switch ( Type )
    {
    case LOG_CRIT:
      if ( (filter & LOG_ALLOW_CRIT) == 0 )
	return false;
      break;

    case LOG_ALERT:
      if ( (filter & LOG_ALLOW_ALERT) == 0 )
	return false;
      break;

    case LOG_NOTICE:
      if ( (filter & LOG_ALLOW_NOTICE) == 0 )
	return false;
      break;

    case LOG_ERROR:
      if ( (filter & LOG_ALLOW_ERROR) == 0 )
	return false;
      break;

    case LOG_WARN:
      if ( (filter & LOG_ALLOW_WARN) == 0 )
	return false;
      break;

    case LOG_INFO:
      if ( (filter & LOG_ALLOW_INFO) == 0 )
	return false;
      break;

    case LOG_DEBUG:
      if ( (filter & LOG_ALLOW_DEBUG) == 0 )
	return false;
      break;

    case LOG_MAX:
      break;
    }

 return true;
}